

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ColumnDefault(Vdbe *v,Table *pTab,int i,int iReg)

{
  int iVar1;
  Expr *pExpr;
  sqlite3 *db;
  Op *pOVar2;
  Mem *in_RAX;
  ValueNewStat4Ctx *in_R9;
  sqlite3_value *pValue;
  sqlite3_value *local_28;
  
  local_28 = in_RAX;
  if (pTab->pSelect == (Select *)0x0) {
    local_28 = (Mem *)0x0;
    pExpr = pTab->aCol[i].pDflt;
    if (pExpr != (Expr *)0x0) {
      valueFromExpr(v->db,pExpr,v->db->enc,pTab->aCol[i].affinity,&local_28,in_R9);
    }
    if (local_28 != (Mem *)0x0) {
      db = v->db;
      if (db->mallocFailed == '\0') {
        pOVar2 = v->aOp;
        iVar1 = v->nOp;
        pOVar2[(long)iVar1 + -1].p4type = -7;
        pOVar2[(long)iVar1 + -1].p4.pMem = local_28;
      }
      else if (db->pnBytesFreed == (int *)0x0) {
        sqlite3ValueFree(local_28);
      }
      else {
        freeP4Mem(db,local_28);
      }
    }
  }
  if (pTab->aCol[i].affinity == 'E') {
    sqlite3VdbeAddOp3(v,0x5c,iReg,0,0);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ColumnDefault(Vdbe *v, Table *pTab, int i, int iReg){
  assert( pTab!=0 );
  if( !pTab->pSelect ){
    sqlite3_value *pValue = 0;
    u8 enc = ENC(sqlite3VdbeDb(v));
    Column *pCol = &pTab->aCol[i];
    VdbeComment((v, "%s.%s", pTab->zName, pCol->zName));
    assert( i<pTab->nCol );
    sqlite3ValueFromExpr(sqlite3VdbeDb(v), pCol->pDflt, enc, 
                         pCol->affinity, &pValue);
    if( pValue ){
      sqlite3VdbeAppendP4(v, pValue, P4_MEM);
    }
  }
#ifndef SQLITE_OMIT_FLOATING_POINT
  if( pTab->aCol[i].affinity==SQLITE_AFF_REAL ){
    sqlite3VdbeAddOp1(v, OP_RealAffinity, iReg);
  }
#endif
}